

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcheckedint_impl.h
# Opt level: O3

QRect __thiscall QRect::operator|(QRect *this,QRect *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  undefined8 uVar16;
  QRect QVar17;
  
  uVar5 = (this->x1).m_i;
  uVar6 = (this->y1).m_i;
  iVar1 = uVar5 - 1;
  iVar2 = uVar6 - 1;
  iVar7 = (this->x2).m_i;
  iVar8 = (this->y2).m_i;
  if (iVar8 == iVar2 && iVar7 == iVar1) {
    uVar13._0_4_ = r->x1;
    uVar13._4_4_ = r->y1;
    uVar16._0_4_ = r->x2;
    uVar16._4_4_ = r->y2;
  }
  else {
    uVar12 = (r->x1).m_i;
    uVar14 = (r->y1).m_i;
    iVar3 = uVar12 - 1;
    iVar4 = uVar14 - 1;
    iVar9 = (r->x2).m_i;
    iVar10 = (r->y2).m_i;
    if (iVar10 != iVar4 || iVar9 != iVar3) {
      iVar11 = iVar1;
      if (iVar1 < iVar7) {
        iVar11 = iVar7;
      }
      if (iVar7 < iVar1) {
        uVar5 = iVar7 + 1;
      }
      if (iVar9 < iVar3) {
        uVar12 = iVar9 + 1;
      }
      if (iVar3 < iVar9) {
        iVar3 = iVar9;
      }
      if (iVar8 < iVar2) {
        uVar6 = iVar8 + 1;
      }
      if (iVar2 < iVar8) {
        iVar2 = iVar8;
      }
      if (iVar10 < iVar4) {
        uVar14 = iVar10 + 1;
      }
      if (iVar4 < iVar10) {
        iVar4 = iVar10;
      }
      if ((int)uVar5 < (int)uVar12) {
        uVar12 = uVar5;
      }
      uVar13 = (ulong)uVar12;
      if (iVar3 < iVar11) {
        iVar3 = iVar11;
      }
      if ((int)uVar6 < (int)uVar14) {
        uVar14 = uVar6;
      }
      uVar15 = (ulong)uVar14;
      if (iVar4 < iVar2) {
        iVar4 = iVar2;
      }
      uVar16 = CONCAT44(iVar4,iVar3);
      goto LAB_003842f5;
    }
    uVar13._0_4_ = this->x1;
    uVar13._4_4_ = this->y1;
    uVar16._0_4_ = this->x2;
    uVar16._4_4_ = this->y2;
  }
  uVar15 = uVar13 >> 0x20;
LAB_003842f5:
  QVar17._0_8_ = uVar13 & 0xffffffff | uVar15 << 0x20;
  QVar17.x2.m_i = (int)uVar16;
  QVar17.y2.m_i = (int)((ulong)uVar16 >> 0x20);
  return QVar17;
}

Assistant:

Q_DECLARE_STRONGLY_ORDERED_LITERAL_TYPE(
        QCheckedInt,
        AInt,
        template <typename AInt, if_is_same_int<AInt> = true>)
};

template <typename Int, typename I, typename P>
Q_DECL_CONST_FUNCTION size_t constexpr inline qHash(QCheckedInt<Int, I, P> key, size_t seed = 0) noexcept
{
    using QT_PREPEND_NAMESPACE(qHash);
    return qHash(key.value(), seed);
}